

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosNetwork.cpp
# Opt level: O2

string * adios2::helper::GetClusterName_abi_cxx11_(void)

{
  long lVar1;
  string *in_RDI;
  string fqdn;
  
  GetFQDN_abi_cxx11_();
  lVar1 = std::__cxx11::string::rfind((char *)&fqdn,0x6d06de);
  if (lVar1 == 0) {
    std::__cxx11::string::find((char)&fqdn,0x2e);
    std::__cxx11::string::erase((ulong)&fqdn,0);
  }
  lVar1 = std::__cxx11::string::rfind((char *)&fqdn,0x6d06e4);
  if (lVar1 == 0) {
    std::__cxx11::string::find((char)&fqdn,0x2e);
    std::__cxx11::string::erase((ulong)&fqdn,0);
  }
  std::__cxx11::string::find((char)&fqdn,0x2e);
  std::__cxx11::string::substr((ulong)in_RDI,(ulong)&fqdn);
  std::__cxx11::string::~string((string *)&fqdn);
  return in_RDI;
}

Assistant:

std::string GetClusterName() noexcept
{
    std::string fqdn = GetFQDN();
    if (fqdn.rfind("login", 0) == 0)
    {
        fqdn.erase(0, fqdn.find('.') + 1);
    }
    if (fqdn.rfind("batch", 0) == 0)
    {
        fqdn.erase(0, fqdn.find('.') + 1);
    }
    return fqdn.substr(0, fqdn.find('.'));
}